

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

void __thiscall
Js::JavascriptFunction::JavascriptFunction
          (JavascriptFunction *this,DynamicType *type,FunctionInfo *functionInfo,
          ConstructorCache *cache)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  ConstructorCache **ppCVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *pDVar6;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_00;
  Type local_28;
  ConstructorCache *cache_local;
  FunctionInfo *functionInfo_local;
  DynamicType *type_local;
  JavascriptFunction *this_local;
  
  local_28.ptr = (GlobalObject *)cache;
  cache_local = (ConstructorCache *)functionInfo;
  functionInfo_local = (FunctionInfo *)type;
  type_local = (DynamicType *)this;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e05d38;
  Memory::WriteBarrierPtr<Js::ConstructorCache>::WriteBarrierPtr
            (&this->constructorCache,(ConstructorCache *)local_28.ptr);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierPtr
            (&this->functionInfo,(FunctionInfo *)cache_local);
  ppCVar4 = Memory::WriteBarrierPtr::operator_cast_to_ConstructorCache__
                      ((WriteBarrierPtr *)&this->constructorCache);
  if (*ppCVar4 == (ConstructorCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x39,"(this->constructorCache != nullptr)",
                                "this->constructorCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pDVar6 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  DynamicTypeHandler::ClearHasOnlyWritableDataProperties(pDVar6);
  pDVar6 = DynamicObject::GetTypeHandler(&this->super_DynamicObject);
  bVar3 = DynamicTypeHandler::GetFlags(pDVar6);
  if ((bVar3 & 0x20) != 0) {
    RecyclableObject::GetLibrary((RecyclableObject *)this);
    JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
              ((JavascriptLibrary *)&stack0xffffffffffffffd0);
    this_00 = Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
              operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> *
                         )&stack0xffffffffffffffd0);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_00);
  }
  return;
}

Assistant:

JavascriptFunction::JavascriptFunction(DynamicType * type, FunctionInfo * functionInfo, ConstructorCache* cache)
        : DynamicObject(type), functionInfo(functionInfo), constructorCache(cache)
    {
        Assert(this->constructorCache != nullptr);
        this->GetTypeHandler()->ClearHasOnlyWritableDataProperties(); // length is non-writable
        if (GetTypeHandler()->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            // No need to invalidate store field caches for non-writable properties here. Since this type is just being created, it cannot represent
            // an object that is already a prototype. If it becomes a prototype and then we attempt to add a property to an object derived from this
            // object, then we will check if this property is writable, and only if it is will we do the fast path for add property.
            // GetScriptContext()->InvalidateStoreFieldCaches(PropertyIds::length);
            GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
        }
    }